

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

uint * Ivy_ManCutTruth(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vNodes,
                      Vec_Int_t *vTruth)

{
  undefined8 *puVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int *piVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  Ivy_Man_t *p_00;
  Ivy_Man_t *__ptr;
  ulong uVar12;
  
  p_00 = p;
  Ivy_ManCollectCut(p,pRoot,vLeaves,vNodes);
  iVar9 = vNodes->nSize;
  if (0 < (long)iVar9) {
    piVar7 = vNodes->pArray;
    pVVar3 = p->vObjs;
    lVar11 = 0;
    do {
      iVar2 = piVar7[lVar11];
      if (((long)iVar2 < 0) || (pVVar3->nSize <= iVar2)) goto LAB_007eb1f0;
      p_00 = (Ivy_Man_t *)pVVar3->pArray[iVar2];
      *(int *)((long)&p_00->vPis + 4) = (int)lVar11;
      lVar11 = lVar11 + 1;
    } while (iVar9 != lVar11);
  }
  vTruth->nSize = 0;
  iVar9 = (int)((long)vNodes->nSize << 3);
  if (vTruth->nCap < iVar9) {
    __ptr = (Ivy_Man_t *)vTruth->pArray;
    p_00 = (Ivy_Man_t *)((long)vNodes->nSize << 5);
    if (__ptr == (Ivy_Man_t *)0x0) {
      piVar7 = (int *)malloc((size_t)p_00);
    }
    else {
      piVar7 = (int *)realloc(__ptr,(size_t)p_00);
      p_00 = __ptr;
    }
    vTruth->pArray = piVar7;
    if (piVar7 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vTruth->nCap = iVar9;
  }
  uVar10 = vLeaves->nSize;
  if (0 < (int)uVar10) {
    lVar11 = 0;
    lVar8 = 0;
    do {
      piVar7 = vTruth->pArray;
      uVar4 = *(undefined8 *)((long)Ivy_ManCutTruth::uTruths[0] + lVar11);
      uVar5 = *(undefined8 *)((long)Ivy_ManCutTruth::uTruths[0] + lVar11 + 8);
      uVar6 = *(undefined8 *)((long)Ivy_ManCutTruth::uTruths[0] + lVar11 + 0x18);
      puVar1 = (undefined8 *)((long)piVar7 + lVar11 + 0x10);
      *puVar1 = *(undefined8 *)((long)Ivy_ManCutTruth::uTruths[0] + lVar11 + 0x10);
      puVar1[1] = uVar6;
      puVar1 = (undefined8 *)((long)piVar7 + lVar11);
      *puVar1 = uVar4;
      puVar1[1] = uVar5;
      lVar8 = lVar8 + 1;
      uVar10 = vLeaves->nSize;
      lVar11 = lVar11 + 0x20;
    } while (lVar8 < (int)uVar10);
  }
  if ((int)uVar10 < vNodes->nSize) {
    uVar12 = (ulong)uVar10;
    do {
      if ((int)uVar10 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar9 = vNodes->pArray[uVar12];
      if (((long)iVar9 < 0) || (p->vObjs->nSize <= iVar9)) {
LAB_007eb1f0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Ivy_ManCutTruthOne(p_00,(Ivy_Obj_t *)p->vObjs->pArray[iVar9],vTruth,8);
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < vNodes->nSize);
  }
  return (uint *)(vTruth->pArray + (long)pRoot->TravId * 8);
}

Assistant:

unsigned * Ivy_ManCutTruth( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vNodes, Vec_Int_t * vTruth )
{
    static unsigned uTruths[8][8] = { // elementary truth tables
        { 0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA,0xAAAAAAAA },
        { 0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC,0xCCCCCCCC },
        { 0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0,0xF0F0F0F0 },
        { 0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00,0xFF00FF00 },
        { 0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000,0xFFFF0000 }, 
        { 0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF,0x00000000,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF }, 
        { 0x00000000,0x00000000,0x00000000,0x00000000,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF,0xFFFFFFFF } 
    };
    int i, Leaf;
    // collect the cut
    Ivy_ManCollectCut( p, pRoot, vLeaves, vNodes );
    // set the node numbers
    Vec_IntForEachEntry( vNodes, Leaf, i )
        Ivy_ManObj(p, Leaf)->TravId = i;
    // alloc enough memory
    Vec_IntClear( vTruth );
    Vec_IntGrow( vTruth, 8 * Vec_IntSize(vNodes) );
    // set the elementary truth tables
    Vec_IntForEachEntry( vLeaves, Leaf, i )
        memcpy( Ivy_ObjGetTruthStore(i, vTruth), uTruths[i], 8 * sizeof(unsigned) );
    // compute truths for other nodes
    Vec_IntForEachEntryStart( vNodes, Leaf, i, Vec_IntSize(vLeaves) )
        Ivy_ManCutTruthOne( p, Ivy_ManObj(p, Leaf), vTruth, 8 );
    return Ivy_ObjGetTruthStore( pRoot->TravId, vTruth );
}